

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetSourceFilePropertyCommand.cxx
# Opt level: O0

bool cmGetSourceFilePropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  string *psVar2;
  size_type sVar3;
  bool bVar4;
  const_reference pvVar5;
  reference ppcVar6;
  ulong uVar7;
  string *this;
  cmMakefile *pcVar8;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  bool local_2c9;
  bool local_29d;
  bool local_279;
  bool local_269;
  bool local_251;
  string_view local_230;
  string_view local_220;
  string *local_210;
  cmValue local_208;
  cmValue prop;
  cmSourceFile *local_1d0;
  cmSourceFile *sf;
  string file;
  function<bool_(bool)> local_198;
  bool local_175;
  PolicyStatus local_174;
  bool cmp0163new;
  cmMakefile *pcStack_170;
  PolicyStatus cmp0163;
  cmMakefile *mf;
  char *local_160;
  cmMakefile *local_158;
  char *local_150;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_148;
  value_type local_138;
  cmMakefile *directory_makefile;
  const_reference pvStack_128;
  bool source_file_paths_should_be_absolute;
  string *propName;
  string *var;
  undefined1 local_110 [7];
  bool file_scopes_handled;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  int local_98;
  bool local_92;
  int property_arg_index;
  bool source_file_target_option_enabled;
  bool source_file_directory_option_enabled;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  allocator<char> local_49;
  string local_48;
  size_type local_28;
  size_type args_size;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  args_size = (size_type)status;
  status_local = (cmExecutionStatus *)args;
  local_28 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args);
  sVar3 = args_size;
  if ((local_28 != 3) && (local_28 != 5)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmExecutionStatus::SetError((cmExecutionStatus *)sVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 0;
    goto LAB_004bd248;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&source_file_target_directories.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&property_arg_index);
  bVar4 = false;
  local_92 = false;
  local_98 = 2;
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,2);
  _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar5);
  bVar9 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("DIRECTORY",9);
  local_251 = std::operator==(_Var1,bVar9);
  local_251 = local_251 && local_28 == 5;
  if (local_251) {
    local_98 = 4;
    bVar4 = true;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&source_file_target_directories.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar5);
  }
  else {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,2);
    _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar5);
    bVar9 = (basic_string_view<char,_std::char_traits<char>_>)
            cm::operator____s("TARGET_DIRECTORY",0x10);
    source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)bVar9._M_len;
    local_269 = std::operator==(_Var1,bVar9);
    local_269 = local_269 && local_28 == 5;
    if (local_269) {
      local_98 = 4;
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&property_arg_index,pvVar5);
    }
    local_92 = local_269;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_110);
  var._7_1_ = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                        ((cmExecutionStatus *)args_size,bVar4,local_92,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&source_file_target_directories.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&property_arg_index,
                         (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_110);
  if ((bool)var._7_1_) {
    propName = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,0);
    pvStack_128 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)status_local,(long)local_98);
    local_279 = true;
    if (bVar4 == false) {
      local_279 = local_92;
    }
    directory_makefile._7_1_ = local_279;
    ppcVar6 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[]
                        ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_110,0);
    local_138 = *ppcVar6;
    local_148 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvStack_128);
    bVar9 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("GENERATED",9);
    local_160 = bVar9._M_str;
    mf = (cmMakefile *)bVar9._M_len;
    local_158 = mf;
    local_150 = local_160;
    bVar4 = std::operator==(local_148,bVar9);
    if (bVar4) {
      pcStack_170 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)args_size);
      local_174 = cmMakefile::GetPolicyStatus(local_138,CMP0163,false);
      local_29d = WARN < local_174;
      local_175 = local_29d;
      if (local_29d) {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,1);
        pcVar8 = pcStack_170;
        file.field_2._8_8_ = propName;
        std::function<bool(bool)>::
        function<cmGetSourceFilePropertyCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0,void>
                  ((function<bool(bool)> *)&local_198,
                   (anon_class_16_2_c965d789 *)((long)&file.field_2 + 8));
        args_local._7_1_ =
             GetPropertyCommand::GetSourceFilePropertyGENERATED(pvVar5,pcVar8,&local_198);
        std::function<bool_(bool)>::~function(&local_198);
        var._0_4_ = 1;
        goto LAB_004bd202;
      }
    }
    sVar3 = args_size;
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,1);
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              ((string *)&sf,(cmExecutionStatus *)sVar3,pvVar5,(bool)(directory_makefile._7_1_ & 1))
    ;
    local_1d0 = cmMakefile::GetSource(local_138,(string *)&sf,Ambiguous);
    local_2c9 = false;
    if (local_1d0 == (cmSourceFile *)0x0) {
      _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvStack_128);
      bVar9 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("LOCATION",8);
      prop.Value = (string *)bVar9._M_len;
      local_2c9 = std::operator==(_Var1,bVar9);
    }
    if (local_2c9 != false) {
      local_1d0 = cmMakefile::CreateSource(local_138,(string *)&sf,false,Ambiguous);
    }
    if (local_1d0 == (cmSourceFile *)0x0) {
LAB_004bd192:
      pcVar8 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)args_size);
      psVar2 = propName;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_230,"NOTFOUND");
      cmMakefile::AddDefinition(pcVar8,psVar2,local_230);
    }
    else {
      cmValue::cmValue(&local_208,(nullptr_t)0x0);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        local_210 = (string *)cmSourceFile::GetPropertyForUser(local_1d0,pvStack_128);
        local_208 = (cmValue)local_210;
      }
      bVar4 = cmValue::operator_cast_to_bool(&local_208);
      if (!bVar4) goto LAB_004bd192;
      pcVar8 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)args_size);
      psVar2 = propName;
      this = cmValue::operator*[abi_cxx11_(&local_208);
      local_220 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
      cmMakefile::AddDefinition(pcVar8,psVar2,local_220);
    }
    args_local._7_1_ = 1;
    var._0_4_ = 1;
    std::__cxx11::string::~string((string *)&sf);
  }
  else {
    args_local._7_1_ = 0;
    var._0_4_ = 1;
  }
LAB_004bd202:
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~vector
            ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&property_arg_index);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&source_file_target_directories.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_004bd248:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmGetSourceFilePropertyCommand(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  std::vector<std::string>::size_type args_size = args.size();
  if (args_size != 3 && args_size != 5) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  int property_arg_index = 2;
  if (args[2] == "DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_directory_option_enabled = true;
    source_file_directories.push_back(args[3]);
  } else if (args[2] == "TARGET_DIRECTORY"_s && args_size == 5) {
    property_arg_index = 4;
    source_file_target_option_enabled = true;
    source_file_target_directories.push_back(args[3]);
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  std::string const& var = args[0];
  std::string const& propName = args[property_arg_index];
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;
  cmMakefile& directory_makefile = *source_file_directory_makefiles[0];

  // Special handling for GENERATED property.
  // Note: Only, if CMP0163 is set to NEW!
  if (propName == "GENERATED"_s) {
    auto& mf = status.GetMakefile();
    auto cmp0163 = directory_makefile.GetPolicyStatus(cmPolicies::CMP0163);
    bool const cmp0163new =
      cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
    if (cmp0163new) {
      return GetPropertyCommand::GetSourceFilePropertyGENERATED(
        args[1], mf, [&var, &mf](bool isGenerated) -> bool {
          // Set the value on the original Makefile scope, not the scope of the
          // requested directory.
          mf.AddDefinition(var, (isGenerated) ? cmValue("1") : cmValue("0"));
          return true;
        });
    }
  }

  // Get the source file.
  std::string const file =
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded(
      status, args[1], source_file_paths_should_be_absolute);
  cmSourceFile* sf = directory_makefile.GetSource(file);

  // for the location we must create a source file first
  if (!sf && propName == "LOCATION"_s) {
    sf = directory_makefile.CreateSource(file);
  }

  if (sf) {
    cmValue prop = nullptr;
    if (!propName.empty()) {
      prop = sf->GetPropertyForUser(propName);
    }
    if (prop) {
      // Set the value on the original Makefile scope, not the scope of the
      // requested directory.
      status.GetMakefile().AddDefinition(var, *prop);
      return true;
    }
  }

  // Set the value on the original Makefile scope, not the scope of the
  // requested directory.
  status.GetMakefile().AddDefinition(var, "NOTFOUND");
  return true;
}